

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O3

void __thiscall Imf_3_2::DeepFrameBuffer::insert(DeepFrameBuffer *this,char *name,DeepSlice *slice)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  undefined6 uVar9;
  mapped_type *pmVar10;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  key_type local_1a0;
  
  if (*name != '\0') {
    strncpy(local_1a0._text,name,0xff);
    local_1a0._text[0xff] = '\0';
    pmVar10 = std::
              map<Imf_3_2::Name,_Imf_3_2::DeepSlice,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
              ::operator[](&this->_map,&local_1a0);
    uVar5 = *(undefined4 *)&(slice->super_Slice).field_0x4;
    pcVar1 = (slice->super_Slice).base;
    sVar2 = (slice->super_Slice).xStride;
    sVar3 = (slice->super_Slice).yStride;
    iVar6 = (slice->super_Slice).xSampling;
    iVar7 = (slice->super_Slice).ySampling;
    dVar4 = (slice->super_Slice).fillValue;
    (pmVar10->super_Slice).type = (slice->super_Slice).type;
    *(undefined4 *)&(pmVar10->super_Slice).field_0x4 = uVar5;
    (pmVar10->super_Slice).base = pcVar1;
    (pmVar10->super_Slice).xStride = sVar2;
    (pmVar10->super_Slice).yStride = sVar3;
    (pmVar10->super_Slice).xSampling = iVar6;
    (pmVar10->super_Slice).ySampling = iVar7;
    (pmVar10->super_Slice).fillValue = dVar4;
    bVar8 = (slice->super_Slice).yTileCoords;
    uVar9 = *(undefined6 *)&(slice->super_Slice).field_0x32;
    (pmVar10->super_Slice).xTileCoords = (slice->super_Slice).xTileCoords;
    (pmVar10->super_Slice).yTileCoords = bVar8;
    *(undefined6 *)&(pmVar10->super_Slice).field_0x32 = uVar9;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a0._text + 0x10),
             "Frame buffer slice name cannot be an empty string.",0x32);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,(stringstream *)&local_1a0);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepFrameBuffer::insert (const char name[], const DeepSlice& slice)
{
    if (name[0] == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Frame buffer slice name cannot be an empty string.");
    }

    _map[name] = slice;
}